

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClassSpecificMergeFrom
          (MessageGenerator *this,Printer *printer)

{
  vector<int,_std::allocator<int>_> *fields;
  pointer ppFVar1;
  undefined8 *puVar2;
  pointer piVar3;
  long lVar4;
  MessageGenerator *pMVar5;
  Printer *pPVar6;
  pointer pvVar7;
  bool bVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  uint32_t n;
  uint uVar12;
  LogMessage *pLVar13;
  FieldGenerator *pFVar14;
  LogMessage *pLVar15;
  char *pcVar16;
  string *from;
  ulong uVar17;
  long lVar18;
  int cached_has_word_index_00;
  int extraout_EDX;
  int extraout_EDX_00;
  vector<int,_std::allocator<int>_> *has_bit_indices;
  AlphaNum *a;
  AlphaNum *a_00;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *pFVar19;
  Printer *in_R8;
  undefined8 *puVar20;
  ulong uVar21;
  pointer ppFVar22;
  OneofDescriptor *pOVar23;
  anon_unknown_0 *this_00;
  undefined4 uVar24;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar25;
  undefined4 extraout_XMM0_Db;
  Hex hex;
  Hex hex_00;
  int cached_has_word_index;
  MessageGenerator *local_1a0;
  undefined4 local_194;
  Printer *local_190;
  uint local_184;
  Options *local_180;
  Formatter format;
  string chunk_mask_str;
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  chunks;
  Iterator __begin4;
  Iterator __end3;
  LogMessage local_d0;
  Iterator __end4;
  ColdChunkSkipper cold_skipper;
  
  bVar8 = HasSimpleBaseClass(this->descriptor_,&this->options_);
  if (!bVar8) {
    local_1a0 = this;
    local_190 = printer;
    local_180 = &this->options_;
    format.printer_ = printer;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree(&format.vars_._M_t,&(this->variables_)._M_t);
    Formatter::operator()<>
              (&format,
               "void $classname$::MergeFrom(const $classname$& from) {\n$annotate_mergefrom$// @@protoc_insertion_point(class_specific_merge_from_start:$full_name$)\n  $DCHK$_NE(&from, this);\n"
              );
    io::Printer::Indent(format.printer_);
    Formatter::operator()<>(&format,"$uint32$ cached_has_bits = 0;\n(void) cached_has_bits;\n\n");
    uVar24 = 0;
    uVar25 = 0;
    chunks.
    super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    chunks.
    super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    chunks.
    super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ppFVar1 = (local_1a0->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppFVar22 = (local_1a0->optimized_order_).
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; pMVar5 = local_1a0,
        ppFVar22 != ppFVar1; ppFVar22 = ppFVar22 + 1) {
      pFVar19 = *ppFVar22;
      cold_skipper.chunks_ =
           (vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
            *)pFVar19;
      if (chunks.
          super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          chunks.
          super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
LAB_002dbf81:
        std::
        vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
        ::emplace_back<>(&chunks);
      }
      else {
        iVar10 = HasByteIndex(local_1a0,
                              chunks.
                              super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish[-1].
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish[-1]);
        iVar11 = HasByteIndex(local_1a0,pFVar19);
        if (iVar10 != iVar11) goto LAB_002dbf81;
      }
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::push_back(chunks.
                  super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1,(value_type *)&cold_skipper);
      uVar24 = extraout_XMM0_Da;
      uVar25 = extraout_XMM0_Db;
    }
    fields = &local_1a0->has_bit_indices_;
    anon_unknown_0::ColdChunkSkipper::ColdChunkSkipper
              (&cold_skipper,local_180,&chunks,fields,(double)CONCAT44(uVar25,uVar24));
    cached_has_word_index = -1;
    local_180 = (Options *)&pMVar5->field_generators_;
    uVar21 = 0;
    while( true ) {
      pvVar7 = chunks.
               super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)chunks.
                         super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)chunks.
                        super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar21) break;
      ppFVar22 = chunks.
                 super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar21].
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      from = (string *)
             ((long)chunks.
                    super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar21].
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar22);
      if (from < (string *)0x9) {
        local_194 = 0;
      }
      else {
        iVar10 = HasByteIndex(local_1a0,*ppFVar22);
        local_194 = CONCAT31((int3)((uint)iVar10 >> 8),iVar10 != -1);
      }
      std::__cxx11::string::string((string *)&local_d0,"from.",(allocator *)&chunk_mask_str);
      anon_unknown_0::ColdChunkSkipper::OnStartChunk
                (&cold_skipper,(int)local_190,cached_has_word_index_00,from,in_R8);
      this_00 = (anon_unknown_0 *)(pvVar7 + uVar21);
      std::__cxx11::string::~string((string *)&local_d0);
      if ((char)local_194 != '\0') {
        n = anon_unknown_0::GenChunkMask
                      (this_00,(vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                *)fields,has_bit_indices);
        hex.value = (ulong)n;
        hex._8_8_ = 8;
        strings::AlphaNum::AlphaNum((AlphaNum *)&local_d0,hex);
        StrCat_abi_cxx11_(&chunk_mask_str,(protobuf *)&local_d0,a);
        uVar12 = anon_unknown_0::popcnt(n);
        if ((int)uVar12 < 2) {
          internal::LogMessage::LogMessage
                    (&local_d0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0xe21);
          pLVar13 = internal::LogMessage::operator<<
                              (&local_d0,"CHECK failed: (2) <= (popcnt(chunk_mask)): ");
          internal::LogFinisher::operator=((LogFinisher *)&__end3,pLVar13);
LAB_002dc137:
          internal::LogMessage::~LogMessage(&local_d0);
        }
        else if (8 < uVar12) {
          internal::LogMessage::LogMessage
                    (&local_d0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0xe22);
          pLVar13 = internal::LogMessage::operator<<
                              (&local_d0,"CHECK failed: (8) >= (popcnt(chunk_mask)): ");
          internal::LogFinisher::operator=((LogFinisher *)&__end3,pLVar13);
          goto LAB_002dc137;
        }
        iVar10 = cached_has_word_index;
        iVar11 = HasWordIndex(local_1a0,(FieldDescriptor *)**(undefined8 **)this_00);
        if (iVar10 != iVar11) {
          cached_has_word_index =
               HasWordIndex(local_1a0,(FieldDescriptor *)**(undefined8 **)this_00);
          Formatter::operator()
                    (&format,"cached_has_bits = from._has_bits_[$1$];\n",&cached_has_word_index);
        }
        Formatter::operator()(&format,"if (cached_has_bits & 0x$1$u) {\n",&chunk_mask_str);
        io::Printer::Indent(format.printer_);
        std::__cxx11::string::~string((string *)&chunk_mask_str);
      }
      puVar20 = *(undefined8 **)this_00;
      puVar2 = *(undefined8 **)(this_00 + 8);
      local_184 = 0;
      for (; pPVar6 = local_190, puVar20 != puVar2; puVar20 = puVar20 + 1) {
        pLVar13 = (LogMessage *)*puVar20;
        pFVar14 = FieldGeneratorMap::get((FieldGeneratorMap *)local_180,(FieldDescriptor *)pLVar13);
        bVar9 = *(byte *)((long)&pLVar13->level_ + 1) & 0x60;
        if (bVar9 == 0x20) {
          bVar8 = HasHasbit((FieldDescriptor *)pLVar13);
          if (bVar8) goto LAB_002dc221;
          std::__cxx11::string::string((string *)&local_d0,"from.",(allocator *)&chunk_mask_str);
          pPVar6 = local_190;
          bVar8 = anon_unknown_0::EmitFieldNonDefaultCondition
                            (local_190,(string *)&local_d0,(FieldDescriptor *)pLVar13);
          std::__cxx11::string::~string((string *)&local_d0);
          (*pFVar14->_vptr_FieldGenerator[0xc])(pFVar14,pPVar6);
          if (bVar8) {
            io::Printer::Outdent(format.printer_);
            Formatter::operator()<>(&format,"}\n");
          }
        }
        else if (bVar9 == 0x60) {
          (*pFVar14->_vptr_FieldGenerator[0xc])(pFVar14,local_190);
        }
        else {
LAB_002dc221:
          iVar10 = cached_has_word_index;
          if (*(char *)(*(long *)(pLVar13 + 1) + 0x4f) == '\0') {
            pLVar15 = pLVar13;
            iVar11 = HasWordIndex(local_1a0,(FieldDescriptor *)pLVar13);
            if (iVar10 == iVar11) {
              bVar8 = HasHasbit((FieldDescriptor *)pLVar13);
              iVar10 = extraout_EDX;
              if (!bVar8) {
                internal::LogMessage::LogMessage
                          (&local_d0,LOGLEVEL_DFATAL,
                           "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                           ,0xe4a);
                pLVar15 = internal::LogMessage::operator<<
                                    (&local_d0,"CHECK failed: HasHasbit(field): ");
                internal::LogFinisher::operator=((LogFinisher *)&chunk_mask_str,pLVar15);
                internal::LogMessage::~LogMessage(&local_d0);
                iVar10 = extraout_EDX_00;
              }
              pcVar16 = FieldDescriptor::index((FieldDescriptor *)pLVar13,(char *)pLVar15,iVar10);
              piVar3 = (fields->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              uVar17 = CONCAT71((int7)((ulong)piVar3 >> 8),(char)piVar3[(int)pcVar16]) &
                       0xffffffffffffff1f;
              hex_00.value = 1L << (sbyte)uVar17;
              hex_00._8_8_ = 8;
              strings::AlphaNum::AlphaNum((AlphaNum *)&local_d0,hex_00);
              StrCat_abi_cxx11_(&chunk_mask_str,(protobuf *)&local_d0,a_00);
              Formatter::operator()(&format,"if (cached_has_bits & 0x$1$u) {\n",&chunk_mask_str);
              io::Printer::Indent(format.printer_);
              if ((char)local_194 == '\0') {
LAB_002dc425:
                (*pFVar14->_vptr_FieldGenerator[0xc])(pFVar14,local_190);
              }
              else {
                bVar8 = anon_unknown_0::IsPOD((FieldDescriptor *)pLVar13);
                if (!bVar8) goto LAB_002dc425;
                local_184 = (uint)CONCAT71((int7)(uVar17 >> 8),1);
                (*pFVar14->_vptr_FieldGenerator[0xd])(pFVar14,local_190);
              }
              io::Printer::Outdent(format.printer_);
              Formatter::operator()<>(&format,"}\n");
              std::__cxx11::string::~string((string *)&chunk_mask_str);
              goto LAB_002dc458;
            }
          }
          bVar8 = HasHasbit((FieldDescriptor *)pLVar13);
          pFVar19 = extraout_RDX;
          if (!bVar8) {
            internal::LogMessage::LogMessage
                      (&local_d0,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0xe42);
            pLVar15 = internal::LogMessage::operator<<(&local_d0,"CHECK failed: HasHasbit(field): ")
            ;
            internal::LogFinisher::operator=((LogFinisher *)&chunk_mask_str,pLVar15);
            internal::LogMessage::~LogMessage(&local_d0);
            pFVar19 = extraout_RDX_00;
          }
          FieldName_abi_cxx11_((string *)&local_d0,(cpp *)pLVar13,pFVar19);
          Formatter::operator()
                    (&format,"if (from._internal_has_$1$()) {\n",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0)
          ;
          std::__cxx11::string::~string((string *)&local_d0);
          io::Printer::Indent(format.printer_);
          (*pFVar14->_vptr_FieldGenerator[0xc])(pFVar14,local_190);
          io::Printer::Outdent(format.printer_);
          Formatter::operator()<>(&format,"}\n");
        }
LAB_002dc458:
      }
      if ((char)local_194 != '\0') {
        if ((local_184 & 1) != 0) {
          if (cached_has_word_index < 0) {
            internal::LogMessage::LogMessage
                      (&local_d0,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0xe62);
            pLVar13 = internal::LogMessage::operator<<
                                (&local_d0,"CHECK failed: (0) <= (cached_has_word_index): ");
            internal::LogFinisher::operator=((LogFinisher *)&chunk_mask_str,pLVar13);
            internal::LogMessage::~LogMessage(&local_d0);
          }
          Formatter::operator()
                    (&format,"_has_bits_[$1$] |= cached_has_bits;\n",&cached_has_word_index);
        }
        io::Printer::Outdent(format.printer_);
        Formatter::operator()<>(&format,"}\n");
      }
      bVar8 = anon_unknown_0::ColdChunkSkipper::OnEndChunk(&cold_skipper,(int)uVar21,pPVar6);
      if (bVar8) {
        cached_has_word_index = -1;
      }
      uVar21 = uVar21 + 1;
    }
    chunk_mask_str._M_string_length = (size_type)local_1a0->descriptor_;
    chunk_mask_str._M_dataplus._M_p._0_4_ = 0;
    __end3.idx = *(int *)(chunk_mask_str._M_string_length + 0x6c);
    __end3.descriptor = (Descriptor *)chunk_mask_str._M_string_length;
    while( true ) {
      bVar8 = operator!=((Iterator *)&chunk_mask_str,&__end3);
      pMVar5 = local_1a0;
      if (!bVar8) break;
      lVar18 = (long)(int)chunk_mask_str._M_dataplus._M_p;
      lVar4 = *(long *)(chunk_mask_str._M_string_length + 0x30);
      Formatter::operator()
                (&format,"switch (from.$1$_case()) {\n",
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (lVar4 + 8 + lVar18 * 0x28));
      io::Printer::Indent(format.printer_);
      pOVar23 = (OneofDescriptor *)(lVar4 + lVar18 * 0x28);
      __begin4.idx = 0;
      __end4.idx = *(int *)(pOVar23 + 4);
      __begin4.descriptor = pOVar23;
      __end4.descriptor = pOVar23;
      while( true ) {
        bVar8 = operator!=(&__begin4,&__end4);
        if (!bVar8) break;
        lVar18 = (long)__begin4.idx;
        lVar4 = *(long *)(__begin4.descriptor + 0x20);
        UnderscoresToCamelCase((string *)&local_d0,*(string **)(lVar4 + 8 + lVar18 * 0x48),true);
        Formatter::operator()
                  (&format,"case k$1$: {\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        io::Printer::Indent(format.printer_);
        pFVar14 = FieldGeneratorMap::get
                            ((FieldGeneratorMap *)local_180,
                             (FieldDescriptor *)(lVar4 + lVar18 * 0x48));
        (*pFVar14->_vptr_FieldGenerator[0xc])(pFVar14,local_190);
        Formatter::operator()<>(&format,"break;\n");
        io::Printer::Outdent(format.printer_);
        Formatter::operator()<>(&format,"}\n");
        __begin4.idx = __begin4.idx + 1;
      }
      ToUpper((string *)&local_d0,*(string **)(pOVar23 + 8));
      Formatter::operator()
                (&format,"case $1$_NOT_SET: {\n  break;\n}\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      io::Printer::Outdent(format.printer_);
      Formatter::operator()<>(&format,"}\n");
      chunk_mask_str._M_dataplus._M_p._0_4_ = (int)chunk_mask_str._M_dataplus._M_p + 1;
    }
    if (local_1a0->num_weak_fields_ != 0) {
      Formatter::operator()<>(&format,"_weak_field_map_.MergeFrom(from._weak_field_map_);\n");
    }
    if (0 < *(int *)(pMVar5->descriptor_ + 0x78)) {
      Formatter::operator()<>
                (&format,"_extensions_.MergeFrom(internal_default_instance(), from._extensions_);\n"
                );
    }
    Formatter::operator()<>
              (&format,
               "_internal_metadata_.MergeFrom<$unknown_fields_type$>(from._internal_metadata_);\n");
    io::Printer::Outdent(format.printer_);
    Formatter::operator()<>(&format,"}\n");
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&cold_skipper.variables_._M_t);
    std::
    vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
    ::~vector(&chunks);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&format.vars_._M_t);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateClassSpecificMergeFrom(io::Printer* printer) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  // Generate the class-specific MergeFrom, which avoids the GOOGLE_CHECK and cast.
  Formatter format(printer, variables_);
  format(
      "void $classname$::MergeFrom(const $classname$& from) {\n"
      "$annotate_mergefrom$"
      "// @@protoc_insertion_point(class_specific_merge_from_start:"
      "$full_name$)\n"
      "  $DCHK$_NE(&from, this);\n");
  format.Indent();

  format(
      "$uint32$ cached_has_bits = 0;\n"
      "(void) cached_has_bits;\n\n");

  std::vector<std::vector<const FieldDescriptor*>> chunks = CollectFields(
      optimized_order_,
      [&](const FieldDescriptor* a, const FieldDescriptor* b) -> bool {
        return HasByteIndex(a) == HasByteIndex(b);
      });

  ColdChunkSkipper cold_skipper(options_, chunks, has_bit_indices_, kColdRatio);

  // cached_has_word_index maintains that:
  //   cached_has_bits = from._has_bits_[cached_has_word_index]
  // for cached_has_word_index >= 0
  int cached_has_word_index = -1;

  for (int chunk_index = 0; chunk_index < chunks.size(); chunk_index++) {
    const std::vector<const FieldDescriptor*>& chunk = chunks[chunk_index];
    bool have_outer_if =
        chunk.size() > 1 && HasByteIndex(chunk.front()) != kNoHasbit;
    cold_skipper.OnStartChunk(chunk_index, cached_has_word_index, "from.",
                              printer);

    if (have_outer_if) {
      // Emit an if() that will let us skip the whole chunk if none are set.
      uint32_t chunk_mask = GenChunkMask(chunk, has_bit_indices_);
      std::string chunk_mask_str =
          StrCat(strings::Hex(chunk_mask, strings::ZERO_PAD_8));

      // Check (up to) 8 has_bits at a time if we have more than one field in
      // this chunk.  Due to field layout ordering, we may check
      // _has_bits_[last_chunk * 8 / 32] multiple times.
      GOOGLE_DCHECK_LE(2, popcnt(chunk_mask));
      GOOGLE_DCHECK_GE(8, popcnt(chunk_mask));

      if (cached_has_word_index != HasWordIndex(chunk.front())) {
        cached_has_word_index = HasWordIndex(chunk.front());
        format("cached_has_bits = from._has_bits_[$1$];\n",
               cached_has_word_index);
      }

      format("if (cached_has_bits & 0x$1$u) {\n", chunk_mask_str);
      format.Indent();
    }

    // Go back and emit merging code for each of the fields we processed.
    bool deferred_has_bit_changes = false;
    for (const auto field : chunk) {
      const FieldGenerator& generator = field_generators_.get(field);

      if (field->is_repeated()) {
        generator.GenerateMergingCode(printer);
      } else if (field->is_optional() && !HasHasbit(field)) {
        // Merge semantics without true field presence: primitive fields are
        // merged only if non-zero (numeric) or non-empty (string).
        bool have_enclosing_if =
            EmitFieldNonDefaultCondition(printer, "from.", field);
        generator.GenerateMergingCode(printer);
        if (have_enclosing_if) {
          format.Outdent();
          format("}\n");
        }
      } else if (field->options().weak() ||
                 cached_has_word_index != HasWordIndex(field)) {
        // Check hasbit, not using cached bits.
        GOOGLE_CHECK(HasHasbit(field));
        format("if (from._internal_has_$1$()) {\n", FieldName(field));
        format.Indent();
        generator.GenerateMergingCode(printer);
        format.Outdent();
        format("}\n");
      } else {
        // Check hasbit, using cached bits.
        GOOGLE_CHECK(HasHasbit(field));
        int has_bit_index = has_bit_indices_[field->index()];
        const std::string mask = StrCat(
            strings::Hex(1u << (has_bit_index % 32), strings::ZERO_PAD_8));
        format("if (cached_has_bits & 0x$1$u) {\n", mask);
        format.Indent();

        if (have_outer_if && IsPOD(field)) {
          // Defer hasbit modification until the end of chunk.
          // This can reduce the number of loads/stores by up to 7 per 8 fields.
          deferred_has_bit_changes = true;
          generator.GenerateCopyConstructorCode(printer);
        } else {
          generator.GenerateMergingCode(printer);
        }

        format.Outdent();
        format("}\n");
      }
    }

    if (have_outer_if) {
      if (deferred_has_bit_changes) {
        // Flush the has bits for the primitives we deferred.
        GOOGLE_CHECK_LE(0, cached_has_word_index);
        format("_has_bits_[$1$] |= cached_has_bits;\n", cached_has_word_index);
      }

      format.Outdent();
      format("}\n");
    }

    if (cold_skipper.OnEndChunk(chunk_index, printer)) {
      // Reset here as it may have been updated in just closed if statement.
      cached_has_word_index = -1;
    }
  }

  // Merge oneof fields. Oneof field requires oneof case check.
  for (auto oneof : OneOfRange(descriptor_)) {
    format("switch (from.$1$_case()) {\n", oneof->name());
    format.Indent();
    for (auto field : FieldRange(oneof)) {
      format("case k$1$: {\n", UnderscoresToCamelCase(field->name(), true));
      format.Indent();
      if (!IsFieldStripped(field, options_)) {
        field_generators_.get(field).GenerateMergingCode(printer);
      }
      format("break;\n");
      format.Outdent();
      format("}\n");
    }
    format(
        "case $1$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        ToUpper(oneof->name()));
    format.Outdent();
    format("}\n");
  }
  if (num_weak_fields_) {
    format("_weak_field_map_.MergeFrom(from._weak_field_map_);\n");
  }

  // Merging of extensions and unknown fields is done last, to maximize
  // the opportunity for tail calls.
  if (descriptor_->extension_range_count() > 0) {
    format(
        "_extensions_.MergeFrom(internal_default_instance(), "
        "from._extensions_);\n");
  }

  format(
      "_internal_metadata_.MergeFrom<$unknown_fields_type$>(from._internal_"
      "metadata_);\n");

  format.Outdent();
  format("}\n");
}